

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestSchema::readRawData(TestSchema *this)

{
  InputBuffer local_3e0;
  Parser<avro::ReaderImpl<avro::NullValidator>_> local_3d0;
  ostream os;
  ifstream in;
  streambuf local_208 [504];
  
  std::ifstream::ifstream(&in,"test.avro",_S_in);
  avro::ostream::ostream(&os);
  std::ostream::operator<<(&os,local_208);
  avro::InputBuffer::InputBuffer(&local_3e0,(OutputBuffer *)&os.super_ostream.field_0x48);
  local_3d0.reader_.reader_.bufferImpl_.px = local_3e0.pimpl_.px;
  local_3d0.reader_.reader_.bufferImpl_.pn.pi_ = local_3e0.pimpl_.pn.pi_;
  if (local_3e0.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_3e0.pimpl_.pn.pi_)->use_count_ = (local_3e0.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_3d0.reader_.reader_.iter_._M_cur =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_3d0.reader_.reader_.iter_._M_first =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_3d0.reader_.reader_.iter_._M_last =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_3d0.reader_.reader_.iter_._M_node =
       ((local_3e0.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_3d0.reader_.reader_.bytes_ = (local_3e0.pimpl_.px)->size_;
  local_3d0.reader_.reader_.chunkPos_ = 0;
  local_3d0.reader_.reader_.bytesRemaining_ = local_3d0.reader_.reader_.bytes_;
  boost::detail::shared_count::~shared_count(&local_3e0.pimpl_.pn);
  readData<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this,&local_3d0);
  boost::detail::shared_count::~shared_count(&local_3d0.reader_.reader_.bufferImpl_.pn);
  avro::ostream::~ostream(&os);
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

void readRawData() {
        std::ifstream in("test.avro");
        ostream os;
        os << in.rdbuf();
        Parser<Reader> p(os.getBuffer());
        readData(p);
    }